

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode sasl_decode_digest_md5_message
                   (char *chlg64,char *nonce,size_t nlen,char *realm,size_t rlen,char *alg,
                   size_t alen,char *qop,size_t qlen)

{
  _Bool _Var1;
  CURLcode CVar2;
  size_t sVar3;
  size_t chlg64len;
  size_t chlglen;
  uchar *chlg;
  char *pcStack_40;
  CURLcode result;
  char *alg_local;
  size_t rlen_local;
  char *realm_local;
  size_t nlen_local;
  char *nonce_local;
  char *chlg64_local;
  
  chlg._4_4_ = 0;
  chlglen = 0;
  chlg64len = 0;
  pcStack_40 = alg;
  alg_local = (char *)rlen;
  rlen_local = (size_t)realm;
  realm_local = (char *)nlen;
  nlen_local = (size_t)nonce;
  nonce_local = chlg64;
  sVar3 = strlen(chlg64);
  if ((sVar3 != 0) && (*nonce_local != '=')) {
    CVar2 = Curl_base64_decode(nonce_local,(uchar **)&chlglen,&chlg64len);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    chlg._4_4_ = 0;
  }
  if (chlglen == 0) {
    chlg64_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    _Var1 = sasl_digest_get_key_value
                      ((char *)chlglen,"nonce=\"",(char *)nlen_local,(size_t)realm_local,'\"');
    if (_Var1) {
      _Var1 = sasl_digest_get_key_value
                        ((char *)chlglen,"realm=\"",(char *)rlen_local,(size_t)alg_local,'\"');
      if (!_Var1) {
        strcpy((char *)rlen_local,"");
      }
      _Var1 = sasl_digest_get_key_value((char *)chlglen,"algorithm=",pcStack_40,alen,',');
      if (_Var1) {
        _Var1 = sasl_digest_get_key_value((char *)chlglen,"qop=\"",qop,qlen,'\"');
        if (_Var1) {
          (*Curl_cfree)((void *)chlglen);
          chlg64_local._4_4_ = CURLE_OK;
        }
        else {
          (*Curl_cfree)((void *)chlglen);
          chlg64_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
        }
      }
      else {
        (*Curl_cfree)((void *)chlglen);
        chlg64_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
      }
    }
    else {
      (*Curl_cfree)((void *)chlglen);
      chlg64_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
    }
  }
  return chlg64_local._4_4_;
}

Assistant:

static CURLcode sasl_decode_digest_md5_message(const char *chlg64,
                                               char *nonce, size_t nlen,
                                               char *realm, size_t rlen,
                                               char *alg, size_t alen,
                                               char *qop, size_t qlen)
{
  CURLcode result = CURLE_OK;
  unsigned char *chlg = NULL;
  size_t chlglen = 0;
  size_t chlg64len = strlen(chlg64);

  /* Decode the base-64 encoded challenge message */
  if(chlg64len && *chlg64 != '=') {
    result = Curl_base64_decode(chlg64, &chlg, &chlglen);
    if(result)
      return result;
  }

  /* Ensure we have a valid challenge message */
  if(!chlg)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Retrieve nonce string from the challenge */
  if(!sasl_digest_get_key_value((char *)chlg, "nonce=\"", nonce, nlen, '\"')) {
    free(chlg);
    return CURLE_BAD_CONTENT_ENCODING;
  }

  /* Retrieve realm string from the challenge */
  if(!sasl_digest_get_key_value((char *)chlg, "realm=\"", realm, rlen, '\"')) {
    /* Challenge does not have a realm, set empty string [RFC2831] page 6 */
    strcpy(realm, "");
  }

  /* Retrieve algorithm string from the challenge */
  if(!sasl_digest_get_key_value((char *)chlg, "algorithm=", alg, alen, ',')) {
    free(chlg);
    return CURLE_BAD_CONTENT_ENCODING;
  }

  /* Retrieve qop-options string from the challenge */
  if(!sasl_digest_get_key_value((char *)chlg, "qop=\"", qop, qlen, '\"')) {
    free(chlg);
    return CURLE_BAD_CONTENT_ENCODING;
  }

  free(chlg);

  return CURLE_OK;
}